

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_448ecb::Db::parseUnresolvedType(Db *this)

{
  char *pcVar1;
  Node *pNVar2;
  Node *TP;
  Node *local_18;
  
  pcVar1 = this->First;
  if (this->Last != pcVar1) {
    if (*pcVar1 == 'T') {
      pNVar2 = parseTemplateParam(this);
    }
    else {
      if ((this->Last == pcVar1) || (*pcVar1 != 'D')) goto LAB_001b7e76;
      pNVar2 = parseDecltype(this);
    }
    if (pNVar2 == (Node *)0x0) {
      pNVar2 = (Node *)0x0;
    }
    else {
      local_18 = pNVar2;
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&local_18);
    }
    return pNVar2;
  }
LAB_001b7e76:
  pNVar2 = parseSubstitution(this);
  return pNVar2;
}

Assistant:

Node *Db::parseUnresolvedType() {
  if (look() == 'T') {
    Node *TP = parseTemplateParam();
    if (TP == nullptr)
      return nullptr;
    Subs.push_back(TP);
    return TP;
  }
  if (look() == 'D') {
    Node *DT = parseDecltype();
    if (DT == nullptr)
      return nullptr;
    Subs.push_back(DT);
    return DT;
  }
  return parseSubstitution();
}